

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O3

void __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response::
Response(Response *this,
        shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
        *session_,long timeout_content)

{
  undefined1 *puVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  basic_streambuf<std::allocator<char>_> *this_00;
  allocator<char> local_21;
  
  puVar1 = &(this->super_ostream).field_0x68;
  std::ios_base::ios_base((ios_base *)puVar1);
  *(undefined8 *)&this->field_0x140 = 0;
  *(undefined2 *)&this->field_0x148 = 0;
  *(undefined8 *)&this->field_0x150 = 0;
  *(undefined8 *)&this->field_0x158 = 0;
  *(undefined8 *)&this->field_0x160 = 0;
  *(undefined8 *)&this->field_0x168 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x8 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x10 = 0;
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x1a9050;
  *(undefined8 *)&(this->super_ostream).field_0x68 = 0x1a9078;
  std::ios::init((streambuf *)puVar1);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)&PTR__Response_001a9000;
  *(undefined ***)&(this->super_ostream).field_0x68 = &PTR__Response_001a9028;
  this_00 = (basic_streambuf<std::allocator<char>_> *)operator_new(0x60);
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (this_00,0xffffffffffffffff,&local_21);
  *(basic_streambuf<std::allocator<char>_> **)&(this->super_ostream).field_0x18 = this_00;
  *(undefined8 *)&(this->super_ostream).field_0x28 = 0;
  peVar2 = (session_->
           super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var3 = (session_->
           super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (session_->
  super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)&(this->super_ostream).field_0x20 = peVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ostream).field_0x28 = p_Var3;
  (session_->
  super___shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  *(long *)&(this->super_ostream).field_0x30 = timeout_content;
  asio::io_context::strand::strand
            ((strand *)&(this->super_ostream).field_0x38,
             *(io_context **)
              (**(long **)(**(long **)&(this->super_ostream).field_0x20 + 0x20) + 0x18));
  puVar1 = &(this->super_ostream).field_0x48;
  *(undefined1 **)&(this->super_ostream).field_0x50 = puVar1;
  *(undefined1 **)&(this->super_ostream).field_0x48 = puVar1;
  *(undefined8 *)&(this->super_ostream).field_0x58 = 0;
  (this->super_ostream).field_0x60 = 0;
  std::ios::rdbuf((streambuf *)
                  ((long)&(this->super_ostream)._vptr_basic_ostream +
                  (long)(this->super_ostream)._vptr_basic_ostream[-3]));
  return;
}

Assistant:

Response(std::shared_ptr<Session> session_, long timeout_content) noexcept : std::ostream(nullptr), session(std::move(session_)), timeout_content(timeout_content), strand(session->connection->socket->get_io_service()) {
        rdbuf(streambuf.get());
      }